

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# approximate_quantile.cpp
# Opt level: O1

double duckdb::ApproxQuantileCoding::Encode<signed_char,double>(char *input)

{
  char input_00;
  bool bVar1;
  InvalidInputException *this;
  char input_01;
  double result;
  double local_40;
  string local_38;
  
  input_00 = *input;
  bVar1 = TryCast::Operation<signed_char,double>(input_00,&local_40,false);
  if (bVar1) {
    return local_40;
  }
  this = (InvalidInputException *)__cxa_allocate_exception(0x10);
  CastExceptionText<signed_char,double>(&local_38,(duckdb *)(ulong)(uint)(int)input_00,input_01);
  InvalidInputException::InvalidInputException(this,(string *)&local_38);
  __cxa_throw(this,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

unique_ptr<FunctionData> Copy() const override {
		return make_uniq<ApproximateQuantileBindData>(quantiles);
	}